

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
ObjectTest_basic_value_constructor_forward_list_Test::TestBody
          (ObjectTest_basic_value_constructor_forward_list_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_ab0 [8];
  Message local_aa8 [8];
  _Fwd_list_impl local_aa0;
  _Fwd_list_impl local_a98;
  undefined1 local_a90 [8];
  undefined1 local_a88 [8];
  AssertionResult gtest_ar_12;
  AssertHelper local_a58 [8];
  Message local_a50 [15];
  bool local_a41;
  undefined1 local_a40 [8];
  AssertionResult gtest_ar__12;
  undefined1 local_a28 [8];
  object test_object___12;
  AssertHelper local_9e0 [8];
  Message local_9d8 [8];
  _Fwd_list_impl local_9d0;
  _Fwd_list_impl local_9c8;
  undefined1 local_9c0 [8];
  undefined1 local_9b8 [8];
  AssertionResult gtest_ar_11;
  AssertHelper local_988 [8];
  Message local_980 [15];
  bool local_971;
  undefined1 local_970 [8];
  AssertionResult gtest_ar__11;
  undefined1 local_958 [8];
  object test_object___11;
  AssertHelper local_910 [8];
  Message local_908 [8];
  _Fwd_list_impl local_900;
  _Fwd_list_impl local_8f8;
  undefined1 local_8f0 [8];
  undefined1 local_8e8 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_8b8 [8];
  Message local_8b0 [15];
  bool local_8a1;
  undefined1 local_8a0 [8];
  AssertionResult gtest_ar__10;
  undefined1 local_888 [8];
  object test_object___10;
  AssertHelper local_840 [8];
  Message local_838 [8];
  _Fwd_list_impl local_830;
  _Fwd_list_impl local_828;
  undefined1 local_820 [8];
  undefined1 local_818 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_7e8 [8];
  Message local_7e0 [15];
  bool local_7d1;
  undefined1 local_7d0 [8];
  AssertionResult gtest_ar__9;
  undefined1 local_7b8 [8];
  object test_object___9;
  AssertHelper local_770 [8];
  Message local_768 [8];
  _Fwd_list_impl local_760;
  _Fwd_list_impl local_758;
  undefined1 local_750 [8];
  undefined1 local_748 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_718 [8];
  Message local_710 [15];
  bool local_701;
  undefined1 local_700 [8];
  AssertionResult gtest_ar__8;
  undefined1 local_6e8 [8];
  object test_object___8;
  AssertHelper local_6a0 [8];
  Message local_698 [8];
  _Fwd_list_impl local_690;
  _Fwd_list_impl local_688;
  undefined1 local_680 [8];
  undefined1 local_678 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_648 [8];
  Message local_640 [15];
  bool local_631;
  undefined1 local_630 [8];
  AssertionResult gtest_ar__7;
  undefined1 local_618 [8];
  object test_object___7;
  AssertHelper local_5d0 [8];
  Message local_5c8 [8];
  _Fwd_list_impl local_5c0;
  _Fwd_list_impl local_5b8;
  undefined1 local_5b0 [8];
  undefined1 local_5a8 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_578 [8];
  Message local_570 [15];
  bool local_561;
  undefined1 local_560 [8];
  AssertionResult gtest_ar__6;
  undefined1 local_548 [8];
  object test_object___6;
  AssertHelper local_500 [8];
  Message local_4f8 [8];
  _Fwd_list_impl local_4f0;
  _Fwd_list_impl local_4e8;
  undefined1 local_4e0 [8];
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_4a8 [8];
  Message local_4a0 [15];
  bool local_491;
  undefined1 local_490 [8];
  AssertionResult gtest_ar__5;
  undefined1 local_478 [8];
  object test_object___5;
  AssertHelper local_430 [8];
  Message local_428 [8];
  _Fwd_list_impl local_420;
  _Fwd_list_impl local_418;
  undefined1 local_410 [8];
  undefined1 local_408 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_3d8 [8];
  Message local_3d0 [15];
  bool local_3c1;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar__4;
  undefined1 local_3a8 [8];
  object test_object___4;
  AssertHelper local_360 [8];
  Message local_358 [8];
  _Fwd_list_impl local_350;
  _Fwd_list_impl local_348;
  undefined1 local_340 [8];
  undefined1 local_338 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_308 [8];
  Message local_300 [15];
  bool local_2f1;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar__3;
  undefined1 local_2d8 [8];
  object test_object___3;
  AssertHelper local_290 [8];
  Message local_288 [8];
  _Fwd_list_impl local_280;
  _Fwd_list_impl local_278;
  undefined1 local_270 [8];
  undefined1 local_268 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_238 [8];
  Message local_230 [15];
  bool local_221;
  undefined1 local_220 [8];
  AssertionResult gtest_ar__2;
  undefined1 local_208 [8];
  object test_object___2;
  AssertHelper local_1c0 [8];
  Message local_1b8 [8];
  _Fwd_list_impl local_1b0;
  _Fwd_list_impl local_1a8;
  undefined1 local_1a0 [8];
  undefined1 local_198 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_168 [8];
  Message local_160 [15];
  bool local_151;
  undefined1 local_150 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_138 [8];
  object test_object___1;
  AssertHelper local_f0 [8];
  Message local_e8 [8];
  _Fwd_list_impl local_e0;
  _Fwd_list_impl local_d8;
  undefined1 local_d0 [8];
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_98 [8];
  Message local_90 [15];
  bool local_81;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_;
  _Fwd_list_impl local_60;
  undefined1 local_58 [8];
  object test_object__;
  ObjectTest_basic_value_constructor_forward_list_Test *this_local;
  
  local_60._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<bool,_std::allocator<bool>_>::forward_list
            ((forward_list<bool,_std::allocator<bool>_> *)&local_60);
  jessilib::object::object<std::forward_list<bool,_std::allocator<bool>_>,_nullptr>
            ((object *)local_58,(forward_list<bool,_std::allocator<bool>_> *)&local_60);
  std::forward_list<bool,_std::allocator<bool>_>::~forward_list
            ((forward_list<bool,_std::allocator<bool>_> *)&local_60);
  local_81 = jessilib::object::has<std::forward_list<bool,std::allocator<bool>>>((object *)local_58)
  ;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_80,&local_81,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar.message_,local_80,
               "test_object__ .has< std::forward_list<bool> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x195,pcVar2);
    testing::internal::AssertHelper::operator=(local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(local_98);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_d8._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<bool,_std::allocator<bool>_>::forward_list
            ((forward_list<bool,_std::allocator<bool>_> *)&local_d8);
  jessilib::object::
  get<std::forward_list<bool,_std::allocator<bool>_>,_std::forward_list<bool,_std::allocator<bool>_>,_nullptr>
            ((object *)local_d0,(forward_list<bool,_std::allocator<bool>_> *)local_58);
  local_e0._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<bool,_std::allocator<bool>_>::forward_list
            ((forward_list<bool,_std::allocator<bool>_> *)&local_e0);
  testing::internal::EqHelper::
  Compare<std::forward_list<bool,_std::allocator<bool>_>,_std::forward_list<bool,_std::allocator<bool>_>,_nullptr>
            ((EqHelper *)local_c8,"test_object__.get< std::forward_list<bool> >()",
             "std::forward_list<bool> {}",(forward_list<bool,_std::allocator<bool>_> *)local_d0,
             (forward_list<bool,_std::allocator<bool>_> *)&local_e0);
  std::forward_list<bool,_std::allocator<bool>_>::~forward_list
            ((forward_list<bool,_std::allocator<bool>_> *)&local_e0);
  std::forward_list<bool,_std::allocator<bool>_>::~forward_list
            ((forward_list<bool,_std::allocator<bool>_> *)local_d0);
  std::forward_list<bool,_std::allocator<bool>_>::~forward_list
            ((forward_list<bool,_std::allocator<bool>_> *)&local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x195,pcVar2);
    testing::internal::AssertHelper::operator=(local_f0,local_e8);
    testing::internal::AssertHelper::~AssertHelper(local_f0);
    testing::Message::~Message(local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  jessilib::object::~object((object *)local_58);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::forward_list<signed_char,_std::allocator<signed_char>_>::forward_list
            ((forward_list<signed_char,_std::allocator<signed_char>_> *)&gtest_ar__1.message_);
  jessilib::object::object<std::forward_list<signed_char,_std::allocator<signed_char>_>,_nullptr>
            ((object *)local_138,
             (forward_list<signed_char,_std::allocator<signed_char>_> *)&gtest_ar__1.message_);
  std::forward_list<signed_char,_std::allocator<signed_char>_>::~forward_list
            ((forward_list<signed_char,_std::allocator<signed_char>_> *)&gtest_ar__1.message_);
  local_151 = jessilib::object::has<std::forward_list<signed_char,std::allocator<signed_char>>>
                        ((object *)local_138);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_150,&local_151,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_1.message_,local_150,
               "test_object__ .has< std::forward_list<signed char> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_1.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x196,pcVar2);
    testing::internal::AssertHelper::operator=(local_168,local_160);
    testing::internal::AssertHelper::~AssertHelper(local_168);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  local_1a8._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<signed_char,_std::allocator<signed_char>_>::forward_list
            ((forward_list<signed_char,_std::allocator<signed_char>_> *)&local_1a8);
  jessilib::object::
  get<std::forward_list<signed_char,_std::allocator<signed_char>_>,_std::forward_list<signed_char,_std::allocator<signed_char>_>,_nullptr>
            ((object *)local_1a0,
             (forward_list<signed_char,_std::allocator<signed_char>_> *)local_138);
  local_1b0._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<signed_char,_std::allocator<signed_char>_>::forward_list
            ((forward_list<signed_char,_std::allocator<signed_char>_> *)&local_1b0);
  testing::internal::EqHelper::
  Compare<std::forward_list<signed_char,_std::allocator<signed_char>_>,_std::forward_list<signed_char,_std::allocator<signed_char>_>,_nullptr>
            ((EqHelper *)local_198,"test_object__.get< std::forward_list<signed char> >()",
             "std::forward_list<signed char> {}",
             (forward_list<signed_char,_std::allocator<signed_char>_> *)local_1a0,
             (forward_list<signed_char,_std::allocator<signed_char>_> *)&local_1b0);
  std::forward_list<signed_char,_std::allocator<signed_char>_>::~forward_list
            ((forward_list<signed_char,_std::allocator<signed_char>_> *)&local_1b0);
  std::forward_list<signed_char,_std::allocator<signed_char>_>::~forward_list
            ((forward_list<signed_char,_std::allocator<signed_char>_> *)local_1a0);
  std::forward_list<signed_char,_std::allocator<signed_char>_>::~forward_list
            ((forward_list<signed_char,_std::allocator<signed_char>_> *)&local_1a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(local_1b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              (local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x196,pcVar2);
    testing::internal::AssertHelper::operator=(local_1c0,local_1b8);
    testing::internal::AssertHelper::~AssertHelper(local_1c0);
    testing::Message::~Message(local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  jessilib::object::~object((object *)local_138);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>::forward_list
            ((forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__2.message_);
  jessilib::object::
  object<std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>,_nullptr>
            ((object *)local_208,
             (forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__2.message_);
  std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>::~forward_list
            ((forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__2.message_);
  local_221 = jessilib::object::has<std::forward_list<unsigned_char,std::allocator<unsigned_char>>>
                        ((object *)local_208);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_220,&local_221,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_2.message_,local_220,
               "test_object__ .has< std::forward_list<unsigned char> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_2.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x197,pcVar2);
    testing::internal::AssertHelper::operator=(local_238,local_230);
    testing::internal::AssertHelper::~AssertHelper(local_238);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  local_278._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>::forward_list
            ((forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)&local_278);
  jessilib::object::
  get<std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>,_std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>,_nullptr>
            ((object *)local_270,
             (forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)local_208);
  local_280._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>::forward_list
            ((forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)&local_280);
  testing::internal::EqHelper::
  Compare<std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>,_std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>,_nullptr>
            ((EqHelper *)local_268,"test_object__.get< std::forward_list<unsigned char> >()",
             "std::forward_list<unsigned char> {}",
             (forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)local_270,
             (forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)&local_280);
  std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>::~forward_list
            ((forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)&local_280);
  std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>::~forward_list
            ((forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)local_270);
  std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>::~forward_list
            ((forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)&local_278);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(local_288);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
    testing::internal::AssertHelper::AssertHelper
              (local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x197,pcVar2);
    testing::internal::AssertHelper::operator=(local_290,local_288);
    testing::internal::AssertHelper::~AssertHelper(local_290);
    testing::Message::~Message(local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  jessilib::object::~object((object *)local_208);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::forward_list<short,_std::allocator<short>_>::forward_list
            ((forward_list<short,_std::allocator<short>_> *)&gtest_ar__3.message_);
  jessilib::object::object<std::forward_list<short,_std::allocator<short>_>,_nullptr>
            ((object *)local_2d8,
             (forward_list<short,_std::allocator<short>_> *)&gtest_ar__3.message_);
  std::forward_list<short,_std::allocator<short>_>::~forward_list
            ((forward_list<short,_std::allocator<short>_> *)&gtest_ar__3.message_);
  local_2f1 = jessilib::object::has<std::forward_list<short,std::allocator<short>>>
                        ((object *)local_2d8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2f0,&local_2f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar1) {
    testing::Message::Message(local_300);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_3.message_,local_2f0,
               "test_object__ .has< std::forward_list<short> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_3.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x198,pcVar2);
    testing::internal::AssertHelper::operator=(local_308,local_300);
    testing::internal::AssertHelper::~AssertHelper(local_308);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  local_348._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<short,_std::allocator<short>_>::forward_list
            ((forward_list<short,_std::allocator<short>_> *)&local_348);
  jessilib::object::
  get<std::forward_list<short,_std::allocator<short>_>,_std::forward_list<short,_std::allocator<short>_>,_nullptr>
            ((object *)local_340,(forward_list<short,_std::allocator<short>_> *)local_2d8);
  local_350._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<short,_std::allocator<short>_>::forward_list
            ((forward_list<short,_std::allocator<short>_> *)&local_350);
  testing::internal::EqHelper::
  Compare<std::forward_list<short,_std::allocator<short>_>,_std::forward_list<short,_std::allocator<short>_>,_nullptr>
            ((EqHelper *)local_338,"test_object__.get< std::forward_list<short> >()",
             "std::forward_list<short> {}",(forward_list<short,_std::allocator<short>_> *)local_340,
             (forward_list<short,_std::allocator<short>_> *)&local_350);
  std::forward_list<short,_std::allocator<short>_>::~forward_list
            ((forward_list<short,_std::allocator<short>_> *)&local_350);
  std::forward_list<short,_std::allocator<short>_>::~forward_list
            ((forward_list<short,_std::allocator<short>_> *)local_340);
  std::forward_list<short,_std::allocator<short>_>::~forward_list
            ((forward_list<short,_std::allocator<short>_> *)&local_348);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar1) {
    testing::Message::Message(local_358);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
    testing::internal::AssertHelper::AssertHelper
              (local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x198,pcVar2);
    testing::internal::AssertHelper::operator=(local_360,local_358);
    testing::internal::AssertHelper::~AssertHelper(local_360);
    testing::Message::~Message(local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  jessilib::object::~object((object *)local_2d8);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::forward_list<int,_std::allocator<int>_>::forward_list
            ((forward_list<int,_std::allocator<int>_> *)&gtest_ar__4.message_);
  jessilib::object::object<std::forward_list<int,_std::allocator<int>_>,_nullptr>
            ((object *)local_3a8,(forward_list<int,_std::allocator<int>_> *)&gtest_ar__4.message_);
  std::forward_list<int,_std::allocator<int>_>::~forward_list
            ((forward_list<int,_std::allocator<int>_> *)&gtest_ar__4.message_);
  local_3c1 = jessilib::object::has<std::forward_list<int,std::allocator<int>>>((object *)local_3a8)
  ;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3c0,&local_3c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
  if (!bVar1) {
    testing::Message::Message(local_3d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_4.message_,local_3c0,
               "test_object__ .has< std::forward_list<int> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_4.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x199,pcVar2);
    testing::internal::AssertHelper::operator=(local_3d8,local_3d0);
    testing::internal::AssertHelper::~AssertHelper(local_3d8);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(local_3d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
  local_418._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<int,_std::allocator<int>_>::forward_list
            ((forward_list<int,_std::allocator<int>_> *)&local_418);
  jessilib::object::
  get<std::forward_list<int,_std::allocator<int>_>,_std::forward_list<int,_std::allocator<int>_>,_nullptr>
            ((object *)local_410,(forward_list<int,_std::allocator<int>_> *)local_3a8);
  local_420._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<int,_std::allocator<int>_>::forward_list
            ((forward_list<int,_std::allocator<int>_> *)&local_420);
  testing::internal::EqHelper::
  Compare<std::forward_list<int,_std::allocator<int>_>,_std::forward_list<int,_std::allocator<int>_>,_nullptr>
            ((EqHelper *)local_408,"test_object__.get< std::forward_list<int> >()",
             "std::forward_list<int> {}",(forward_list<int,_std::allocator<int>_> *)local_410,
             (forward_list<int,_std::allocator<int>_> *)&local_420);
  std::forward_list<int,_std::allocator<int>_>::~forward_list
            ((forward_list<int,_std::allocator<int>_> *)&local_420);
  std::forward_list<int,_std::allocator<int>_>::~forward_list
            ((forward_list<int,_std::allocator<int>_> *)local_410);
  std::forward_list<int,_std::allocator<int>_>::~forward_list
            ((forward_list<int,_std::allocator<int>_> *)&local_418);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
  if (!bVar1) {
    testing::Message::Message(local_428);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
    testing::internal::AssertHelper::AssertHelper
              (local_430,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x199,pcVar2);
    testing::internal::AssertHelper::operator=(local_430,local_428);
    testing::internal::AssertHelper::~AssertHelper(local_430);
    testing::Message::~Message(local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
  jessilib::object::~object((object *)local_3a8);
  gtest_ar__5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::forward_list<long,_std::allocator<long>_>::forward_list
            ((forward_list<long,_std::allocator<long>_> *)&gtest_ar__5.message_);
  jessilib::object::object<std::forward_list<long,_std::allocator<long>_>,_nullptr>
            ((object *)local_478,(forward_list<long,_std::allocator<long>_> *)&gtest_ar__5.message_)
  ;
  std::forward_list<long,_std::allocator<long>_>::~forward_list
            ((forward_list<long,_std::allocator<long>_> *)&gtest_ar__5.message_);
  local_491 = jessilib::object::has<std::forward_list<long,std::allocator<long>>>
                        ((object *)local_478);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_490,&local_491,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar1) {
    testing::Message::Message(local_4a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_5.message_,local_490,
               "test_object__ .has< std::forward_list<long> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_5.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_4a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x19a,pcVar2);
    testing::internal::AssertHelper::operator=(local_4a8,local_4a0);
    testing::internal::AssertHelper::~AssertHelper(local_4a8);
    std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
    testing::Message::~Message(local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  local_4e8._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<long,_std::allocator<long>_>::forward_list
            ((forward_list<long,_std::allocator<long>_> *)&local_4e8);
  jessilib::object::
  get<std::forward_list<long,_std::allocator<long>_>,_std::forward_list<long,_std::allocator<long>_>,_nullptr>
            ((object *)local_4e0,(forward_list<long,_std::allocator<long>_> *)local_478);
  local_4f0._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<long,_std::allocator<long>_>::forward_list
            ((forward_list<long,_std::allocator<long>_> *)&local_4f0);
  testing::internal::EqHelper::
  Compare<std::forward_list<long,_std::allocator<long>_>,_std::forward_list<long,_std::allocator<long>_>,_nullptr>
            ((EqHelper *)local_4d8,"test_object__.get< std::forward_list<long> >()",
             "std::forward_list<long> {}",(forward_list<long,_std::allocator<long>_> *)local_4e0,
             (forward_list<long,_std::allocator<long>_> *)&local_4f0);
  std::forward_list<long,_std::allocator<long>_>::~forward_list
            ((forward_list<long,_std::allocator<long>_> *)&local_4f0);
  std::forward_list<long,_std::allocator<long>_>::~forward_list
            ((forward_list<long,_std::allocator<long>_> *)local_4e0);
  std::forward_list<long,_std::allocator<long>_>::~forward_list
            ((forward_list<long,_std::allocator<long>_> *)&local_4e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
  if (!bVar1) {
    testing::Message::Message(local_4f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4d8);
    testing::internal::AssertHelper::AssertHelper
              (local_500,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x19a,pcVar2);
    testing::internal::AssertHelper::operator=(local_500,local_4f8);
    testing::internal::AssertHelper::~AssertHelper(local_500);
    testing::Message::~Message(local_4f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
  jessilib::object::~object((object *)local_478);
  gtest_ar__6.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::forward_list<long_long,_std::allocator<long_long>_>::forward_list
            ((forward_list<long_long,_std::allocator<long_long>_> *)&gtest_ar__6.message_);
  jessilib::object::object<std::forward_list<long_long,_std::allocator<long_long>_>,_nullptr>
            ((object *)local_548,
             (forward_list<long_long,_std::allocator<long_long>_> *)&gtest_ar__6.message_);
  std::forward_list<long_long,_std::allocator<long_long>_>::~forward_list
            ((forward_list<long_long,_std::allocator<long_long>_> *)&gtest_ar__6.message_);
  local_561 = jessilib::object::has<std::forward_list<long_long,std::allocator<long_long>>>
                        ((object *)local_548);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_560,&local_561,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_560);
  if (!bVar1) {
    testing::Message::Message(local_570);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_6.message_,local_560,
               "test_object__ .has< std::forward_list<long long> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_6.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_578,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x19b,pcVar2);
    testing::internal::AssertHelper::operator=(local_578,local_570);
    testing::internal::AssertHelper::~AssertHelper(local_578);
    std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
    testing::Message::~Message(local_570);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
  local_5b8._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<long_long,_std::allocator<long_long>_>::forward_list
            ((forward_list<long_long,_std::allocator<long_long>_> *)&local_5b8);
  jessilib::object::
  get<std::forward_list<long_long,_std::allocator<long_long>_>,_std::forward_list<long_long,_std::allocator<long_long>_>,_nullptr>
            ((object *)local_5b0,(forward_list<long_long,_std::allocator<long_long>_> *)local_548);
  local_5c0._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<long_long,_std::allocator<long_long>_>::forward_list
            ((forward_list<long_long,_std::allocator<long_long>_> *)&local_5c0);
  testing::internal::EqHelper::
  Compare<std::forward_list<long_long,_std::allocator<long_long>_>,_std::forward_list<long_long,_std::allocator<long_long>_>,_nullptr>
            ((EqHelper *)local_5a8,"test_object__.get< std::forward_list<long long> >()",
             "std::forward_list<long long> {}",
             (forward_list<long_long,_std::allocator<long_long>_> *)local_5b0,
             (forward_list<long_long,_std::allocator<long_long>_> *)&local_5c0);
  std::forward_list<long_long,_std::allocator<long_long>_>::~forward_list
            ((forward_list<long_long,_std::allocator<long_long>_> *)&local_5c0);
  std::forward_list<long_long,_std::allocator<long_long>_>::~forward_list
            ((forward_list<long_long,_std::allocator<long_long>_> *)local_5b0);
  std::forward_list<long_long,_std::allocator<long_long>_>::~forward_list
            ((forward_list<long_long,_std::allocator<long_long>_> *)&local_5b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a8);
  if (!bVar1) {
    testing::Message::Message(local_5c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5a8);
    testing::internal::AssertHelper::AssertHelper
              (local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x19b,pcVar2);
    testing::internal::AssertHelper::operator=(local_5d0,local_5c8);
    testing::internal::AssertHelper::~AssertHelper(local_5d0);
    testing::Message::~Message(local_5c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a8);
  jessilib::object::~object((object *)local_548);
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::forward_list<long,_std::allocator<long>_>::forward_list
            ((forward_list<long,_std::allocator<long>_> *)&gtest_ar__7.message_);
  jessilib::object::object<std::forward_list<long,_std::allocator<long>_>,_nullptr>
            ((object *)local_618,(forward_list<long,_std::allocator<long>_> *)&gtest_ar__7.message_)
  ;
  std::forward_list<long,_std::allocator<long>_>::~forward_list
            ((forward_list<long,_std::allocator<long>_> *)&gtest_ar__7.message_);
  local_631 = jessilib::object::has<std::forward_list<long,std::allocator<long>>>
                        ((object *)local_618);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_630,&local_631,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_630);
  if (!bVar1) {
    testing::Message::Message(local_640);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_7.message_,local_630,
               "test_object__ .has< std::forward_list<intmax_t> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_7.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_648,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x19c,pcVar2);
    testing::internal::AssertHelper::operator=(local_648,local_640);
    testing::internal::AssertHelper::~AssertHelper(local_648);
    std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
    testing::Message::~Message(local_640);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_630);
  local_688._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<long,_std::allocator<long>_>::forward_list
            ((forward_list<long,_std::allocator<long>_> *)&local_688);
  jessilib::object::
  get<std::forward_list<long,_std::allocator<long>_>,_std::forward_list<long,_std::allocator<long>_>,_nullptr>
            ((object *)local_680,(forward_list<long,_std::allocator<long>_> *)local_618);
  local_690._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<long,_std::allocator<long>_>::forward_list
            ((forward_list<long,_std::allocator<long>_> *)&local_690);
  testing::internal::EqHelper::
  Compare<std::forward_list<long,_std::allocator<long>_>,_std::forward_list<long,_std::allocator<long>_>,_nullptr>
            ((EqHelper *)local_678,"test_object__.get< std::forward_list<intmax_t> >()",
             "std::forward_list<intmax_t> {}",(forward_list<long,_std::allocator<long>_> *)local_680
             ,(forward_list<long,_std::allocator<long>_> *)&local_690);
  std::forward_list<long,_std::allocator<long>_>::~forward_list
            ((forward_list<long,_std::allocator<long>_> *)&local_690);
  std::forward_list<long,_std::allocator<long>_>::~forward_list
            ((forward_list<long,_std::allocator<long>_> *)local_680);
  std::forward_list<long,_std::allocator<long>_>::~forward_list
            ((forward_list<long,_std::allocator<long>_> *)&local_688);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_678);
  if (!bVar1) {
    testing::Message::Message(local_698);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_678);
    testing::internal::AssertHelper::AssertHelper
              (local_6a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x19c,pcVar2);
    testing::internal::AssertHelper::operator=(local_6a0,local_698);
    testing::internal::AssertHelper::~AssertHelper(local_6a0);
    testing::Message::~Message(local_698);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_678);
  jessilib::object::~object((object *)local_618);
  gtest_ar__8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::forward_list<float,_std::allocator<float>_>::forward_list
            ((forward_list<float,_std::allocator<float>_> *)&gtest_ar__8.message_);
  jessilib::object::object<std::forward_list<float,_std::allocator<float>_>,_nullptr>
            ((object *)local_6e8,
             (forward_list<float,_std::allocator<float>_> *)&gtest_ar__8.message_);
  std::forward_list<float,_std::allocator<float>_>::~forward_list
            ((forward_list<float,_std::allocator<float>_> *)&gtest_ar__8.message_);
  local_701 = jessilib::object::has<std::forward_list<float,std::allocator<float>>>
                        ((object *)local_6e8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_700,&local_701,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_700);
  if (!bVar1) {
    testing::Message::Message(local_710);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_8.message_,local_700,
               "test_object__ .has< std::forward_list<float> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_8.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_718,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x19d,pcVar2);
    testing::internal::AssertHelper::operator=(local_718,local_710);
    testing::internal::AssertHelper::~AssertHelper(local_718);
    std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
    testing::Message::~Message(local_710);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_700);
  local_758._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<float,_std::allocator<float>_>::forward_list
            ((forward_list<float,_std::allocator<float>_> *)&local_758);
  jessilib::object::
  get<std::forward_list<float,_std::allocator<float>_>,_std::forward_list<float,_std::allocator<float>_>,_nullptr>
            ((object *)local_750,(forward_list<float,_std::allocator<float>_> *)local_6e8);
  local_760._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<float,_std::allocator<float>_>::forward_list
            ((forward_list<float,_std::allocator<float>_> *)&local_760);
  testing::internal::EqHelper::
  Compare<std::forward_list<float,_std::allocator<float>_>,_std::forward_list<float,_std::allocator<float>_>,_nullptr>
            ((EqHelper *)local_748,"test_object__.get< std::forward_list<float> >()",
             "std::forward_list<float> {}",(forward_list<float,_std::allocator<float>_> *)local_750,
             (forward_list<float,_std::allocator<float>_> *)&local_760);
  std::forward_list<float,_std::allocator<float>_>::~forward_list
            ((forward_list<float,_std::allocator<float>_> *)&local_760);
  std::forward_list<float,_std::allocator<float>_>::~forward_list
            ((forward_list<float,_std::allocator<float>_> *)local_750);
  std::forward_list<float,_std::allocator<float>_>::~forward_list
            ((forward_list<float,_std::allocator<float>_> *)&local_758);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_748);
  if (!bVar1) {
    testing::Message::Message(local_768);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_748);
    testing::internal::AssertHelper::AssertHelper
              (local_770,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x19d,pcVar2);
    testing::internal::AssertHelper::operator=(local_770,local_768);
    testing::internal::AssertHelper::~AssertHelper(local_770);
    testing::Message::~Message(local_768);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_748);
  jessilib::object::~object((object *)local_6e8);
  gtest_ar__9.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::forward_list<double,_std::allocator<double>_>::forward_list
            ((forward_list<double,_std::allocator<double>_> *)&gtest_ar__9.message_);
  jessilib::object::object<std::forward_list<double,_std::allocator<double>_>,_nullptr>
            ((object *)local_7b8,
             (forward_list<double,_std::allocator<double>_> *)&gtest_ar__9.message_);
  std::forward_list<double,_std::allocator<double>_>::~forward_list
            ((forward_list<double,_std::allocator<double>_> *)&gtest_ar__9.message_);
  local_7d1 = jessilib::object::has<std::forward_list<double,std::allocator<double>>>
                        ((object *)local_7b8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7d0,&local_7d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d0);
  if (!bVar1) {
    testing::Message::Message(local_7e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_9.message_,local_7d0,
               "test_object__ .has< std::forward_list<double> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_9.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_7e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x19e,pcVar2);
    testing::internal::AssertHelper::operator=(local_7e8,local_7e0);
    testing::internal::AssertHelper::~AssertHelper(local_7e8);
    std::__cxx11::string::~string((string *)&gtest_ar_9.message_);
    testing::Message::~Message(local_7e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d0);
  local_828._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<double,_std::allocator<double>_>::forward_list
            ((forward_list<double,_std::allocator<double>_> *)&local_828);
  jessilib::object::
  get<std::forward_list<double,_std::allocator<double>_>,_std::forward_list<double,_std::allocator<double>_>,_nullptr>
            ((object *)local_820,(forward_list<double,_std::allocator<double>_> *)local_7b8);
  local_830._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<double,_std::allocator<double>_>::forward_list
            ((forward_list<double,_std::allocator<double>_> *)&local_830);
  testing::internal::EqHelper::
  Compare<std::forward_list<double,_std::allocator<double>_>,_std::forward_list<double,_std::allocator<double>_>,_nullptr>
            ((EqHelper *)local_818,"test_object__.get< std::forward_list<double> >()",
             "std::forward_list<double> {}",
             (forward_list<double,_std::allocator<double>_> *)local_820,
             (forward_list<double,_std::allocator<double>_> *)&local_830);
  std::forward_list<double,_std::allocator<double>_>::~forward_list
            ((forward_list<double,_std::allocator<double>_> *)&local_830);
  std::forward_list<double,_std::allocator<double>_>::~forward_list
            ((forward_list<double,_std::allocator<double>_> *)local_820);
  std::forward_list<double,_std::allocator<double>_>::~forward_list
            ((forward_list<double,_std::allocator<double>_> *)&local_828);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_818);
  if (!bVar1) {
    testing::Message::Message(local_838);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_818);
    testing::internal::AssertHelper::AssertHelper
              (local_840,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x19e,pcVar2);
    testing::internal::AssertHelper::operator=(local_840,local_838);
    testing::internal::AssertHelper::~AssertHelper(local_840);
    testing::Message::~Message(local_838);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_818);
  jessilib::object::~object((object *)local_7b8);
  gtest_ar__10.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::forward_list<long_double,_std::allocator<long_double>_>::forward_list
            ((forward_list<long_double,_std::allocator<long_double>_> *)&gtest_ar__10.message_);
  jessilib::object::object<std::forward_list<long_double,_std::allocator<long_double>_>,_nullptr>
            ((object *)local_888,
             (forward_list<long_double,_std::allocator<long_double>_> *)&gtest_ar__10.message_);
  std::forward_list<long_double,_std::allocator<long_double>_>::~forward_list
            ((forward_list<long_double,_std::allocator<long_double>_> *)&gtest_ar__10.message_);
  local_8a1 = jessilib::object::has<std::forward_list<long_double,std::allocator<long_double>>>
                        ((object *)local_888);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8a0,&local_8a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a0);
  if (!bVar1) {
    testing::Message::Message(local_8b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_10.message_,local_8a0,
               "test_object__ .has< std::forward_list<long double> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_10.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_8b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x19f,pcVar2);
    testing::internal::AssertHelper::operator=(local_8b8,local_8b0);
    testing::internal::AssertHelper::~AssertHelper(local_8b8);
    std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
    testing::Message::~Message(local_8b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a0);
  local_8f8._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<long_double,_std::allocator<long_double>_>::forward_list
            ((forward_list<long_double,_std::allocator<long_double>_> *)&local_8f8);
  jessilib::object::
  get<std::forward_list<long_double,_std::allocator<long_double>_>,_std::forward_list<long_double,_std::allocator<long_double>_>,_nullptr>
            ((object *)local_8f0,
             (forward_list<long_double,_std::allocator<long_double>_> *)local_888);
  local_900._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<long_double,_std::allocator<long_double>_>::forward_list
            ((forward_list<long_double,_std::allocator<long_double>_> *)&local_900);
  testing::internal::EqHelper::
  Compare<std::forward_list<long_double,_std::allocator<long_double>_>,_std::forward_list<long_double,_std::allocator<long_double>_>,_nullptr>
            ((EqHelper *)local_8e8,"test_object__.get< std::forward_list<long double> >()",
             "std::forward_list<long double> {}",
             (forward_list<long_double,_std::allocator<long_double>_> *)local_8f0,
             (forward_list<long_double,_std::allocator<long_double>_> *)&local_900);
  std::forward_list<long_double,_std::allocator<long_double>_>::~forward_list
            ((forward_list<long_double,_std::allocator<long_double>_> *)&local_900);
  std::forward_list<long_double,_std::allocator<long_double>_>::~forward_list
            ((forward_list<long_double,_std::allocator<long_double>_> *)local_8f0);
  std::forward_list<long_double,_std::allocator<long_double>_>::~forward_list
            ((forward_list<long_double,_std::allocator<long_double>_> *)&local_8f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8e8);
  if (!bVar1) {
    testing::Message::Message(local_908);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8e8);
    testing::internal::AssertHelper::AssertHelper
              (local_910,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x19f,pcVar2);
    testing::internal::AssertHelper::operator=(local_910,local_908);
    testing::internal::AssertHelper::~AssertHelper(local_910);
    testing::Message::~Message(local_908);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8e8);
  jessilib::object::~object((object *)local_888);
  gtest_ar__11.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::
  forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::forward_list((forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                  *)&gtest_ar__11.message_);
  jessilib::object::
  object<std::forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((object *)local_958,
             (forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&gtest_ar__11.message_);
  std::
  forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~forward_list((forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                   *)&gtest_ar__11.message_);
  local_971 = jessilib::object::
              has<std::forward_list<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>>
                        ((object *)local_958);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_970,&local_971,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_970);
  if (!bVar1) {
    testing::Message::Message(local_980);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_11.message_,local_970,
               "test_object__ .has< std::forward_list<std::u8string> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_11.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_988,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1a0,pcVar2);
    testing::internal::AssertHelper::operator=(local_988,local_980);
    testing::internal::AssertHelper::~AssertHelper(local_988);
    std::__cxx11::string::~string((string *)&gtest_ar_11.message_);
    testing::Message::~Message(local_980);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_970);
  local_9c8._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::
  forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::forward_list((forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                  *)&local_9c8);
  jessilib::object::
  get<std::forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((object *)local_9c0,
             (forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)local_958);
  local_9d0._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::
  forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::forward_list((forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                  *)&local_9d0);
  testing::internal::EqHelper::
  Compare<std::forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((EqHelper *)local_9b8,"test_object__.get< std::forward_list<std::u8string> >()",
             "std::forward_list<std::u8string> {}",
             (forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)local_9c0,
             (forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&local_9d0);
  std::
  forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~forward_list((forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                   *)&local_9d0);
  std::
  forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~forward_list((forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                   *)local_9c0);
  std::
  forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~forward_list((forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                   *)&local_9c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9b8);
  if (!bVar1) {
    testing::Message::Message(local_9d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9b8);
    testing::internal::AssertHelper::AssertHelper
              (local_9e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1a0,pcVar2);
    testing::internal::AssertHelper::operator=(local_9e0,local_9d8);
    testing::internal::AssertHelper::~AssertHelper(local_9e0);
    testing::Message::~Message(local_9d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9b8);
  jessilib::object::~object((object *)local_958);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>::forward_list
            ((forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)
             &gtest_ar__12.message_);
  jessilib::object::
  object<std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            ((object *)local_a28,
             (forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)
             &gtest_ar__12.message_);
  std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>::~forward_list
            ((forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)
             &gtest_ar__12.message_);
  local_a41 = jessilib::object::
              has<std::forward_list<jessilib::object,std::allocator<jessilib::object>>>
                        ((object *)local_a28);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a40,&local_a41,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a40);
  if (!bVar1) {
    testing::Message::Message(local_a50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_12.message_,local_a40,
               "test_object__ .has< std::forward_list<object> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_12.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_a58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1a1,pcVar2);
    testing::internal::AssertHelper::operator=(local_a58,local_a50);
    testing::internal::AssertHelper::~AssertHelper(local_a58);
    std::__cxx11::string::~string((string *)&gtest_ar_12.message_);
    testing::Message::~Message(local_a50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a40);
  local_a98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>::forward_list
            ((forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)&local_a98);
  jessilib::object::
  get<std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>,_std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            ((object *)local_a90,
             (forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)local_a28);
  local_aa0._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>::forward_list
            ((forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)&local_aa0);
  testing::internal::EqHelper::
  Compare<std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>,_std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            ((EqHelper *)local_a88,"test_object__.get< std::forward_list<object> >()",
             "std::forward_list<object> {}",
             (forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)local_a90,
             (forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)&local_aa0);
  std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>::~forward_list
            ((forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)&local_aa0);
  std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>::~forward_list
            ((forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)local_a90);
  std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>::~forward_list
            ((forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)&local_a98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a88);
  if (!bVar1) {
    testing::Message::Message(local_aa8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a88);
    testing::internal::AssertHelper::AssertHelper
              (local_ab0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1a1,pcVar2);
    testing::internal::AssertHelper::operator=(local_ab0,local_aa8);
    testing::internal::AssertHelper::~AssertHelper(local_ab0);
    testing::Message::~Message(local_aa8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a88);
  jessilib::object::~object((object *)local_a28);
  return;
}

Assistant:

TEST(ObjectTest, basic_value_constructor_forward_list) {
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<bool>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<signed char>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<unsigned char>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<short>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<int>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<long>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<long long>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<intmax_t>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<float>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<double>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<long double>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<std::u8string>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::forward_list<object>);
}